

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Audio.cpp
# Opt level: O2

bool __thiscall
Amiga::Audio::Channel::output<(Amiga::Audio::Channel::State)4>(Channel *this,Channel *moduland)

{
  uint16_t *puVar1;
  bool bVar2;
  
  puVar1 = &this->period_counter;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 != 0) {
    return false;
  }
  if ((this->dma_enabled == false) && ((this->interrupt_pending & 1U) != 0)) {
    this->state = Disabled;
    this->will_request_interrupt = false;
    return false;
  }
  this->state = PlayingHigh;
  this->output_level = *(int8_t *)((long)&this->data_latch + 1);
  this->volume_latch = this->volume;
  reset_output_phase(this);
  this->period_counter = this->period;
  this->data_latch = this->data;
  bVar2 = this->attach_volume;
  if ((moduland != (Channel *)0x0) && ((bVar2 & 1U) != 0)) {
    moduland->volume = (uint8_t)this->data;
  }
  if (((bVar2 & 1U) != 0) || (this->attach_period == false)) {
    bVar2 = true;
    if (this->dma_enabled != true) goto LAB_001fc2ea;
    this->wants_data = true;
    if (this->will_request_interrupt == true) {
      this->will_request_interrupt = false;
      goto LAB_001fc2ea;
    }
  }
  bVar2 = false;
LAB_001fc2ea:
  decrement_length(this);
  return bVar2;
}

Assistant:

bool Audio::Channel::output<Audio::Channel::State::PlayingLow>(Channel *moduland) {
	-- period_counter;

	if(!period_counter) {
		const bool dma_or_no_interrupt = dma_enabled || !interrupt_pending;
		if(dma_or_no_interrupt) {
			return transit<State::PlayingLow, State::PlayingHigh>(moduland);
		} else {
			return transit<State::PlayingLow, State::Disabled>(moduland);
		}
	}

	return false;
}